

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_extent_ralloc_large_expand(tsdn_t *tsdn,arena_t *arena,extent_t *extent,size_t oldusize)

{
  arena_t *arena_00;
  size_t oldusize_00;
  tsdn_t *in_RCX;
  arena_t *in_RSI;
  tsdn_t *in_RDI;
  size_t udiff;
  size_t usize;
  extent_t *in_stack_ffffffffffffffc8;
  
  arena_00 = (arena_t *)extent_usize_get(in_stack_ffffffffffffffc8);
  oldusize_00 = (long)arena_00 - (long)in_RCX;
  arena_stats_lock(in_RDI,&in_RSI->stats);
  arena_large_ralloc_stats_update(in_RCX,arena_00,oldusize_00,(size_t)in_stack_ffffffffffffffc8);
  arena_stats_unlock(in_RDI,&in_RSI->stats);
  arena_nactive_add(in_RSI,oldusize_00 >> 0xc);
  return;
}

Assistant:

void
arena_extent_ralloc_large_expand(tsdn_t *tsdn, arena_t *arena, extent_t *extent,
    size_t oldusize) {
	size_t usize = extent_usize_get(extent);
	size_t udiff = usize - oldusize;

	if (config_stats) {
		arena_stats_lock(tsdn, &arena->stats);
		arena_large_ralloc_stats_update(tsdn, arena, oldusize, usize);
		arena_stats_unlock(tsdn, &arena->stats);
	}
	arena_nactive_add(arena, udiff >> LG_PAGE);
}